

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  uint fCleanupPis;
  uint fCleanupPos;
  char *pcVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fCleanupPis = 1;
  fCleanupPos = 1;
  fVerbose = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"iovh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x6f) {
      fCleanupPos = fCleanupPos ^ 1;
    }
    else {
      if (iVar1 != 0x69) {
        iVar1 = -2;
        Abc_Print(-2,"usage: cleanup [-iovh]\n");
        Abc_Print(-2,"\t        for logic networks, removes dangling combinatinal logic\n");
        Abc_Print(-2,"\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n");
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (fCleanupPis == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-i    : toggles removing PIs without fanout [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fCleanupPos == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-o    : toggles removing POs with const-0 drivers [default = %s]\n",pcVar3);
        if (fVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v    : print verbose information [default = %s]\n",pcVar4);
        pcVar3 = "\t-h    : print the command usage\n";
LAB_0022068a:
        Abc_Print(iVar1,pcVar3);
        return 1;
      }
      fCleanupPis = fCleanupPis ^ 1;
    }
  }
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (pAVar2->ntkType == ABC_NTK_STRASH) {
      if (fCleanupPis == 0 && fCleanupPos == 0) {
        Abc_Print(-1,"Cleanup for PIs and POs is not enabled.\n");
        goto LAB_00220662;
      }
      pAVar2 = Abc_NtkDarCleanupAig(pAVar2,fCleanupPis,fCleanupPos,fVerbose);
    }
    else {
      Abc_NtkCleanup(pAVar2,fVerbose);
LAB_00220662:
      pAVar2 = Abc_NtkDup(pAVar2);
    }
    if (pAVar2 != (Abc_Ntk_t *)0x0) {
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    pcVar3 = "Cleanup has failed.\n";
  }
  iVar1 = -1;
  goto LAB_0022068a;
}

Assistant:

int Abc_CommandCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fCleanupPis;
    int fCleanupPos;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarCleanupAig( Abc_Ntk_t * pNtk, int fCleanupPis, int fCleanupPos, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fCleanupPis = 1;
    fCleanupPos = 1;
    fVerbose    = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "iovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fCleanupPis ^= 1;
            break;
        case 'o':
            fCleanupPos ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( !fCleanupPis && !fCleanupPos )
        {
            Abc_Print( -1, "Cleanup for PIs and POs is not enabled.\n" );
            pNtkRes = Abc_NtkDup( pNtk );
        }
        else
            pNtkRes = Abc_NtkDarCleanupAig( pNtk, fCleanupPis, fCleanupPos, fVerbose );
    }
    else
    {
        Abc_NtkCleanup( pNtk, fVerbose );
        pNtkRes = Abc_NtkDup( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cleanup [-iovh]\n" );
    Abc_Print( -2, "\t        for logic networks, removes dangling combinatinal logic\n" );
    Abc_Print( -2, "\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n" );
    Abc_Print( -2, "\t-i    : toggles removing PIs without fanout [default = %s]\n", fCleanupPis? "yes": "no" );
    Abc_Print( -2, "\t-o    : toggles removing POs with const-0 drivers [default = %s]\n", fCleanupPos? "yes": "no" );
    Abc_Print( -2, "\t-v    : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}